

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

bool Fixpp::impl::
     doVisitField<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<11u,Fixpp::Type::String>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<198u,Fixpp::Type::String>,Fixpp::TagT<66u,Fixpp::Type::String>,Fixpp::TagT<105u,Fixpp::Type::String>>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<11u,Fixpp::Type::String>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<198u,Fixpp::Type::String>,Fixpp::TagT<66u,Fixpp::Type::String>,Fixpp::TagT<105u,Fixpp::Type::String>>>>::Visitor,0ul,1ul,2ul,3ul,4ul>
               (tuple<Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<198U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<105U,_Fixpp::Type::String>_>_>
                *message,uint tag,Visitor *visitor)

{
  type_by_index_t<0UL,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<198U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<105U,_Fixpp::Type::String>_>_>
  *field;
  type_by_index_t<1UL,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<198U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<105U,_Fixpp::Type::String>_>_>
  *field_00;
  type_by_index_t<2UL,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<198U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<105U,_Fixpp::Type::String>_>_>
  *field_01;
  type_by_index_t<3UL,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<198U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<105U,_Fixpp::Type::String>_>_>
  *field_02;
  type_by_index_t<4UL,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<198U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<105U,_Fixpp::Type::String>_>_>
  *field_03;
  int dummy [6];
  int index;
  Visitor *visitor_local;
  uint tag_local;
  InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<105U,_Fixpp::Type::String>_>_>
  *message_local;
  
  dummy[5] = -1;
  field = meta::
          get<0ul,Fixpp::FieldRef<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<198u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<66u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<105u,Fixpp::Type::String>>>
                    (message);
  doVisitSingleField<0ul,Fixpp::FieldRef<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<11u,Fixpp::Type::String>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<198u,Fixpp::Type::String>,Fixpp::TagT<66u,Fixpp::Type::String>,Fixpp::TagT<105u,Fixpp::Type::String>>>>::Visitor>
            (tag,field,visitor,dummy + 5);
  field_00 = meta::
             get<1ul,Fixpp::FieldRef<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<198u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<66u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<105u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<1ul,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<11u,Fixpp::Type::String>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<198u,Fixpp::Type::String>,Fixpp::TagT<66u,Fixpp::Type::String>,Fixpp::TagT<105u,Fixpp::Type::String>>>>::Visitor>
            (tag,field_00,visitor,dummy + 5);
  dummy[0] = 0;
  field_01 = meta::
             get<2ul,Fixpp::FieldRef<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<198u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<66u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<105u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<2ul,Fixpp::FieldRef<Fixpp::TagT<198u,Fixpp::Type::String>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<11u,Fixpp::Type::String>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<198u,Fixpp::Type::String>,Fixpp::TagT<66u,Fixpp::Type::String>,Fixpp::TagT<105u,Fixpp::Type::String>>>>::Visitor>
            (tag,field_01,visitor,dummy + 5);
  dummy[1] = 0;
  field_02 = meta::
             get<3ul,Fixpp::FieldRef<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<198u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<66u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<105u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<3ul,Fixpp::FieldRef<Fixpp::TagT<66u,Fixpp::Type::String>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<11u,Fixpp::Type::String>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<198u,Fixpp::Type::String>,Fixpp::TagT<66u,Fixpp::Type::String>,Fixpp::TagT<105u,Fixpp::Type::String>>>>::Visitor>
            (tag,field_02,visitor,dummy + 5);
  dummy[2] = 0;
  field_03 = meta::
             get<4ul,Fixpp::FieldRef<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<198u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<66u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<105u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<4ul,Fixpp::FieldRef<Fixpp::TagT<105u,Fixpp::Type::String>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<11u,Fixpp::Type::String>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<198u,Fixpp::Type::String>,Fixpp::TagT<66u,Fixpp::Type::String>,Fixpp::TagT<105u,Fixpp::Type::String>>>>::Visitor>
            (tag,field_03,visitor,dummy + 5);
  dummy[3] = 0;
  if (dummy[5] != -1) {
    std::bitset<5UL>::set
              ((bitset<5UL> *)
               &message[1].base.
                super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_false>
                .value.m_view.second,(long)dummy[5],true);
  }
  return dummy[5] != -1;
}

Assistant:

bool doVisitField(Message& message, unsigned tag, Visitor& visitor,
                          meta::seq::index_sequence<Indexes...>)
        {
            int index = -1;
            int dummy[] = {0, (doVisitSingleField<Indexes>(tag, meta::get<Indexes>(message.values), visitor, &index), 0)...};

            (void) dummy;
            (void) tag;
            (void) visitor;

            if (index != -1)
                message.allBits.set(static_cast<size_t>(index));

            return index != -1;
        }